

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsScissorTests.cpp
# Opt level: O0

void deqp::gls::Functional::anon_unknown_0::drawQuad
               (Functions *gl,deUint32 program,Vec3 *p0,Vec3 *p1)

{
  GLuint GVar1;
  undefined8 uStack_84;
  deInt32 posLoc;
  deUint16 indices [6];
  float position [16];
  float hz;
  Vec3 *p1_local;
  Vec3 *p0_local;
  deUint32 program_local;
  Functions *gl_local;
  
  tcu::Vector<float,_3>::z(p0);
  tcu::Vector<float,_3>::z(p1);
  indices._4_4_ = tcu::Vector<float,_3>::x(p0);
  indices._8_4_ = tcu::Vector<float,_3>::y(p0);
  tcu::Vector<float,_3>::z(p0);
  tcu::Vector<float,_3>::x(p0);
  tcu::Vector<float,_3>::y(p1);
  tcu::Vector<float,_3>::x(p1);
  tcu::Vector<float,_3>::y(p0);
  tcu::Vector<float,_3>::x(p1);
  tcu::Vector<float,_3>::y(p1);
  tcu::Vector<float,_3>::z(p1);
  uStack_84 = 0x2000200010000;
  indices[0] = 1;
  indices[1] = 3;
  GVar1 = (*gl->getAttribLocation)(program,"a_position");
  (*gl->useProgram)(program);
  (*gl->enableVertexAttribArray)(GVar1);
  (*gl->vertexAttribPointer)(GVar1,4,0x1406,'\0',0,indices + 2);
  (*gl->drawElements)(4,6,0x1403,&stack0xffffffffffffff7c);
  (*gl->disableVertexAttribArray)(GVar1);
  return;
}

Assistant:

void drawQuad (const glw::Functions& gl, deUint32 program, const Vec3& p0, const Vec3& p1)
{
	// Vertex data.
	const float hz = (p0.z() + p1.z()) * 0.5f;
	const float position[] =
	{
		p0.x(), p0.y(), p0.z(),	1.0f,
		p0.x(), p1.y(), hz,		1.0f,
		p1.x(), p0.y(), hz,		1.0f,
		p1.x(), p1.y(), p1.z(),	1.0f
	};

	const deUint16	indices[]	= { 0, 1, 2, 2, 1, 3 };

	const deInt32	posLoc		= gl.getAttribLocation(program, "a_position");

	gl.useProgram(program);
	gl.enableVertexAttribArray(posLoc);
	gl.vertexAttribPointer(posLoc, 4, GL_FLOAT, GL_FALSE, 0, &position[0]);

	gl.drawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(indices), GL_UNSIGNED_SHORT, &indices[0]);

	gl.disableVertexAttribArray(posLoc);

}